

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PodVectorTests.cpp
# Opt level: O2

void __thiscall agge::tests::PODVectorTests::NewVectorHasExpectedState(PODVectorTests *this)

{
  long lVar1;
  long lVar2;
  double *pdVar3;
  double *pdVar4;
  allocator local_d1;
  undefined8 local_d0;
  undefined8 local_c8;
  string local_c0;
  LocationInfo local_a0;
  pod_vector<double> empty2;
  pod_vector<char> empty1;
  pod_vector<agge::tests::(anonymous_namespace)::B> Bs;
  pod_vector<agge::tests::(anonymous_namespace)::A> As;
  
  pod_vector<char>::pod_vector(&empty1,0);
  pod_vector<double>::pod_vector(&empty2,0);
  pod_vector<agge::tests::(anonymous_namespace)::A>::pod_vector(&As,10);
  pod_vector<agge::tests::(anonymous_namespace)::B>::pod_vector(&Bs,0x339b);
  lVar1 = CONCAT44(empty1._begin._4_4_,(int)empty1._begin);
  lVar2 = CONCAT44(empty1._end._4_4_,(int)empty1._end);
  std::__cxx11::string::string
            ((string *)&local_c0,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/PodVectorTests.cpp"
             ,(allocator *)&local_d0);
  ut::LocationInfo::LocationInfo(&local_a0,&local_c0,0x2b);
  ut::is_true(lVar1 == lVar2,&local_a0);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  local_d0._0_4_ = 0;
  local_c8._0_4_ = (int)empty1._end - (int)empty1._begin;
  std::__cxx11::string::string
            ((string *)&local_c0,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/PodVectorTests.cpp"
             ,&local_d1);
  ut::LocationInfo::LocationInfo(&local_a0,&local_c0,0x2c);
  ut::are_equal<unsigned_int,unsigned_int>((uint *)&local_d0,(uint *)&local_c8,&local_a0);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  local_d0 = (double *)((ulong)local_d0._4_4_ << 0x20);
  local_c8 = (double *)CONCAT44(local_c8._4_4_,(int)empty1._limit - (int)empty1._begin);
  std::__cxx11::string::string
            ((string *)&local_c0,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/PodVectorTests.cpp"
             ,&local_d1);
  ut::LocationInfo::LocationInfo(&local_a0,&local_c0,0x2d);
  ut::are_equal<unsigned_int,unsigned_int>((uint *)&local_d0,(uint *)&local_c8,&local_a0);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  local_c8._4_4_ = empty1._begin._4_4_;
  local_d0._4_4_ = empty1._end._4_4_;
  std::__cxx11::string::string
            ((string *)&local_c0,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/PodVectorTests.cpp"
             ,&local_d1);
  ut::LocationInfo::LocationInfo(&local_a0,&local_c0,0x2e);
  ut::are_equal<char*,char*>((char **)&local_d0,(char **)&local_c8,&local_a0);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  pdVar4 = empty2._end;
  pdVar3 = empty2._begin;
  std::__cxx11::string::string
            ((string *)&local_c0,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/PodVectorTests.cpp"
             ,(allocator *)&local_d0);
  ut::LocationInfo::LocationInfo(&local_a0,&local_c0,0x2f);
  ut::is_true(pdVar3 == pdVar4,&local_a0);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  local_d0._0_4_ = 0;
  local_c8._0_4_ = (uint)((ulong)((long)empty2._end - (long)empty2._begin) >> 3);
  std::__cxx11::string::string
            ((string *)&local_c0,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/PodVectorTests.cpp"
             ,&local_d1);
  ut::LocationInfo::LocationInfo(&local_a0,&local_c0,0x30);
  ut::are_equal<unsigned_int,unsigned_int>((uint *)&local_d0,(uint *)&local_c8,&local_a0);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  local_d0 = (double *)((ulong)local_d0._4_4_ << 0x20);
  local_c8 = (double *)
             CONCAT44(local_c8._4_4_,(int)((ulong)((long)empty2._limit - (long)empty2._begin) >> 3))
  ;
  std::__cxx11::string::string
            ((string *)&local_c0,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/PodVectorTests.cpp"
             ,&local_d1);
  ut::LocationInfo::LocationInfo(&local_a0,&local_c0,0x31);
  ut::are_equal<unsigned_int,unsigned_int>((uint *)&local_d0,(uint *)&local_c8,&local_a0);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  local_d0 = empty2._end;
  local_c8 = empty2._begin;
  std::__cxx11::string::string
            ((string *)&local_c0,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/PodVectorTests.cpp"
             ,&local_d1);
  ut::LocationInfo::LocationInfo(&local_a0,&local_c0,0x32);
  ut::are_equal<double*,double*>((double **)&local_d0,(double **)&local_c8,&local_a0);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::string
            ((string *)&local_c0,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/PodVectorTests.cpp"
             ,(allocator *)&local_d0);
  ut::LocationInfo::LocationInfo(&local_a0,&local_c0,0x34);
  ut::is_false(As._begin == As._end,&local_a0);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  local_d0 = (double *)CONCAT44(local_d0._4_4_,10);
  local_c8._0_4_ = (uint)((ulong)((long)As._end - (long)As._begin) >> 2);
  std::__cxx11::string::string
            ((string *)&local_c0,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/PodVectorTests.cpp"
             ,&local_d1);
  ut::LocationInfo::LocationInfo(&local_a0,&local_c0,0x35);
  ut::are_equal<unsigned_int,unsigned_int>((uint *)&local_d0,(uint *)&local_c8,&local_a0);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::string
            ((string *)&local_c0,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/PodVectorTests.cpp"
             ,(allocator *)&local_d0);
  ut::LocationInfo::LocationInfo(&local_a0,&local_c0,0x36);
  ut::is_true(9 < (uint)((ulong)((long)As._limit - (long)As._begin) >> 2),&local_a0);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  local_c8._0_4_ = 10;
  local_d0 = (double *)((long)As._end - (long)As._begin >> 2);
  std::__cxx11::string::string
            ((string *)&local_c0,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/PodVectorTests.cpp"
             ,&local_d1);
  ut::LocationInfo::LocationInfo(&local_a0,&local_c0,0x37);
  ut::are_equal<int,long>((int *)&local_c8,&local_d0,&local_a0);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::string
            ((string *)&local_c0,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/PodVectorTests.cpp"
             ,(allocator *)&local_d0);
  ut::LocationInfo::LocationInfo(&local_a0,&local_c0,0x38);
  ut::is_false(Bs._begin == Bs._end,&local_a0);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  local_d0 = (double *)CONCAT44(local_d0._4_4_,0x339b);
  local_c8._0_4_ = (uint)((ulong)((long)Bs._end - (long)Bs._begin) >> 3);
  std::__cxx11::string::string
            ((string *)&local_c0,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/PodVectorTests.cpp"
             ,&local_d1);
  ut::LocationInfo::LocationInfo(&local_a0,&local_c0,0x39);
  ut::are_equal<unsigned_int,unsigned_int>((uint *)&local_d0,(uint *)&local_c8,&local_a0);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::string
            ((string *)&local_c0,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/PodVectorTests.cpp"
             ,(allocator *)&local_d0);
  ut::LocationInfo::LocationInfo(&local_a0,&local_c0,0x3a);
  ut::is_true(0x339a < (uint)((ulong)((long)Bs._limit - (long)Bs._begin) >> 3),&local_a0);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  local_c8 = (double *)CONCAT44(local_c8._4_4_,0x339b);
  local_d0 = (double *)((long)Bs._end - (long)Bs._begin >> 3);
  std::__cxx11::string::string
            ((string *)&local_c0,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/PodVectorTests.cpp"
             ,&local_d1);
  ut::LocationInfo::LocationInfo(&local_a0,&local_c0,0x3b);
  ut::are_equal<int,long>((int *)&local_c8,&local_d0,&local_a0);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  pod_vector<agge::tests::(anonymous_namespace)::B>::~pod_vector(&Bs);
  pod_vector<agge::tests::(anonymous_namespace)::A>::~pod_vector(&As);
  pod_vector<double>::~pod_vector(&empty2);
  pod_vector<char>::~pod_vector(&empty1);
  return;
}

Assistant:

test( NewVectorHasExpectedState )
			{
				// INIT / ACT
				pod_vector<char> empty1;
				pod_vector<double> empty2(0);
				pod_vector<A> As(10);
				const pod_vector<B> Bs(13211);

				// ACT / ASSERT
				assert_is_true(empty1.empty());
				assert_equal(0u, empty1.size());
				assert_equal(0u, empty1.capacity());
				assert_equal(empty1.end(), empty1.begin());
				assert_is_true(empty2.empty());
				assert_equal(0u, empty2.size());
				assert_equal(0u, empty2.capacity());
				assert_equal(empty2.end(), empty2.begin());

				assert_is_false(As.empty());
				assert_equal(10u, As.size());
				assert_is_true(10u <= As.capacity());
				assert_equal(10, As.end() - As.begin());
				assert_is_false(Bs.empty());
				assert_equal(13211u, Bs.size());
				assert_is_true(13211u <= Bs.capacity());
				assert_equal(13211, Bs.end() - Bs.begin());
			}